

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_add_sub(Parser *parser)

{
  void *right;
  bool bVar1;
  Token *local_20;
  Token *tok;
  void *left;
  Parser *parser_local;
  
  tok = (Token *)parse_mul_div(parser);
  local_20 = parser->token;
  while( true ) {
    bVar1 = true;
    if (local_20->kind != ADD) {
      bVar1 = local_20->kind == SUB;
    }
    if (!bVar1) break;
    local_20 = parser->token;
    move(parser);
    right = parse_mul_div(parser);
    tok = (Token *)new_binary_expr(tok,local_20,right);
  }
  return tok;
}

Assistant:

void *parse_add_sub(Parser *parser) {
    void *left = parse_mul_div(parser);
    Token *tok = token(parser);
    while (g_kind(tok) == ADD || g_kind(tok) == SUB) {
        tok = token(parser);
        move(parser);
        left = new_binary_expr(left, tok, parse_mul_div(parser));
    }
    return left;
}